

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_blend.cpp
# Opt level: O3

void V_AddPlayerBlend(player_t *CPlayer,float *blend,float maxinvalpha,int maxpainblend)

{
  byte bVar1;
  uint uVar2;
  APlayerPawn *pAVar3;
  APlayerPawn *pAVar4;
  PalEntry PVar5;
  int iVar6;
  undefined4 extraout_var;
  int iVar7;
  uint uVar8;
  APlayerPawn *pAVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float a;
  PalEntry painFlash;
  float local_38;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_34;
  float local_30;
  FName local_2c;
  PClassPlayerPawn *this;
  
  pAVar9 = (APlayerPawn *)(CPlayer->mo->super_AActor).Inventory.field_0.p;
  local_38 = maxinvalpha;
  if (pAVar9 != (APlayerPawn *)0x0) {
    bVar1 = (byte)(pAVar9->super_AActor).super_DThinker.super_DObject.ObjectFlags;
    pAVar4 = CPlayer->mo;
    while ((bVar1 & 0x20) == 0) {
      PVar5 = AInventory::CallGetBlend((AInventory *)pAVar9);
      if (0xffffff < (uint)PVar5.field_0) {
        local_30 = (float)((uint)PVar5.field_0 >> 0x18) / 255.0;
        V_AddBlend((float)((uint)PVar5.field_0 >> 0x10 & 0xff) / 255.0,
                   (float)((uint)PVar5.field_0 >> 8 & 0xff) / 255.0,
                   (float)((uint)PVar5.field_0 & 0xff) / 255.0,local_30,blend);
        if (local_38 < local_30) {
          local_38 = local_30;
        }
      }
      pAVar3 = (APlayerPawn *)(pAVar9->super_AActor).Inventory.field_0.p;
      if (pAVar3 == (APlayerPawn *)0x0) goto LAB_00489b81;
      pAVar4 = pAVar9;
      pAVar9 = pAVar3;
      bVar1 = (byte)(pAVar3->super_AActor).super_DThinker.super_DObject.ObjectFlags;
    }
    (pAVar4->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
  }
LAB_00489b81:
  if (CPlayer->bonuscount != 0) {
    fVar12 = (float)(CPlayer->bonuscount << 3) * pickup_fade_scalar.Value;
    if ((int)fVar12 < 0x81) {
      fVar12 = (float)(int)fVar12 / 255.0;
    }
    else {
      fVar12 = 0.5;
    }
    V_AddBlend((float)(gameinfo.pickupcolor >> 0x10 & 0xff) / 255.0,
               (float)(gameinfo.pickupcolor >> 8 & 0xff) / 255.0,
               (float)(gameinfo.pickupcolor & 0xff) / 255.0,fVar12,blend);
  }
  pAVar9 = CPlayer->mo;
  local_34 = (anon_union_4_2_12391d7c_for_PalEntry_0)(pAVar9->DamageFade).field_0.d;
  this = (PClassPlayerPawn *)(pAVar9->super_AActor).super_DThinker.super_DObject.Class;
  if (this == (PClassPlayerPawn *)0x0) {
    iVar6 = (**(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar9);
    this = (PClassPlayerPawn *)CONCAT44(extraout_var,iVar6);
    (pAVar9->super_AActor).super_DThinker.super_DObject.Class = (PClass *)this;
    pAVar9 = CPlayer->mo;
  }
  local_2c.Index = (pAVar9->super_AActor).DamageTypeReceived.super_FName.Index;
  PClassPlayerPawn::GetPainFlash(this,&local_2c,(PalEntry *)&local_34.field_0);
  if (local_34.field_0.a != 0) {
    iVar6 = (int)((uint)local_34.field_0.a * CPlayer->damagecount) / 0xff;
    iVar7 = 0x71;
    if (iVar6 < 0x71) {
      iVar7 = iVar6;
    }
    iVar6 = (int)((float)""[iVar7] * blood_fade_scalar.Value);
    if (iVar6 != 0) {
      if (iVar6 < maxpainblend) {
        maxpainblend = iVar6;
      }
      V_AddBlend((float)(local_34.d >> 0x10 & 0xff) / 255.0,(float)(local_34.d >> 8 & 0xff) / 255.0,
                 (float)(local_34.d & 0xff) / 255.0,(float)maxpainblend / 255.0,blend);
    }
  }
  iVar6 = CPlayer->poisoncount;
  if (iVar6 != 0) {
    iVar7 = 0x40;
    if (iVar6 < 0x40) {
      iVar7 = iVar6;
    }
    if (((byte)paletteflash.Value & 2) == 0) {
      a = (float)iVar7 / 93.25714;
      fVar12 = 0.04;
      fVar10 = 0.2571;
      fVar11 = 0.0;
    }
    else {
      a = (float)(iVar7 + 7 >> 3) * 0.1;
      fVar12 = 0.17254902;
      fVar10 = 0.36078432;
      fVar11 = 0.14117648;
    }
    V_AddBlend(fVar12,fVar10,fVar11,a,blend);
  }
  uVar2 = CPlayer->hazardcount;
  if (uVar2 != 0) {
    if (((byte)paletteflash.Value & 8) == 0) {
      uVar8 = uVar2 + 7;
      if (-1 < (int)uVar2) {
        uVar8 = uVar2;
      }
      iVar6 = 0x40;
      if ((int)uVar8 >> 3 < 0x40) {
        iVar6 = (int)uVar8 >> 3;
      }
      V_AddBlend(0.0,0.2571,0.0,(float)iVar6 / 93.25714,blend);
    }
    else if (0x230 < (int)uVar2 || (uVar2 & 8) != 0) {
      fVar12 = blend[3];
      fVar10 = (1.0 - fVar12) * 0.125 + fVar12;
      fVar12 = fVar12 / fVar10;
      fVar11 = (1.0 - fVar12) * 0.0;
      *(ulong *)blend =
           CONCAT44((1.0 - fVar12) + fVar12 * (float)((ulong)*(undefined8 *)blend >> 0x20),
                    fVar11 + fVar12 * (float)*(undefined8 *)blend);
      blend[2] = fVar12 * blend[2] + fVar11;
      blend[3] = fVar10;
    }
  }
  if ((CPlayer->mo->super_AActor).DamageType.super_FName.Index == 0x33) {
    fVar10 = blend[3];
    if (((byte)paletteflash.Value & 4) == 0) {
      fVar12 = (1.0 - fVar10) * 0.4 + fVar10;
      fVar10 = fVar10 / fVar12;
      fVar11 = (1.0 - fVar10) * 0.25;
      *(ulong *)blend = CONCAT44(fVar11 + fVar10 * blend[1],fVar11 + fVar10 * *blend);
      fVar11 = fVar10 * blend[2];
      fVar10 = (1.0 - fVar10) * 0.853;
    }
    else {
      fVar12 = (1.0 - fVar10) * 0.5 + fVar10;
      fVar10 = fVar10 / fVar12;
      fVar11 = (1.0 - fVar10) * 0.0;
      *(ulong *)blend = CONCAT44(fVar11 + fVar10 * blend[1],fVar11 + fVar10 * *blend);
      fVar11 = fVar10 * blend[2];
      fVar10 = (1.0 - fVar10) * 0.8784314;
    }
    blend[2] = fVar10 + fVar11;
    blend[3] = fVar12;
  }
  else {
    fVar12 = blend[3];
  }
  if (local_38 < fVar12) {
    blend[3] = local_38;
  }
  return;
}

Assistant:

void V_AddPlayerBlend (player_t *CPlayer, float blend[4], float maxinvalpha, int maxpainblend)
{
	int cnt;

	// [RH] All powerups can affect the screen blending now
	for (AInventory *item = CPlayer->mo->Inventory; item != NULL; item = item->Inventory)
	{
		PalEntry color = item->CallGetBlend ();
		if (color.a != 0)
		{
			V_AddBlend (color.r/255.f, color.g/255.f, color.b/255.f, color.a/255.f, blend);
			if (color.a/255.f > maxinvalpha) maxinvalpha = color.a/255.f;
		}
	}
	if (CPlayer->bonuscount)
	{
		cnt = CPlayer->bonuscount << 3;

		// [SP] Allow player to tone down intensity of pickup flash.
		cnt = (int)( cnt * pickup_fade_scalar );
		
		V_AddBlend (RPART(gameinfo.pickupcolor)/255.f, GPART(gameinfo.pickupcolor)/255.f, 
					BPART(gameinfo.pickupcolor)/255.f, cnt > 128 ? 0.5f : cnt / 255.f, blend);
	}

	PalEntry painFlash = CPlayer->mo->DamageFade;
	CPlayer->mo->GetClass()->GetPainFlash(CPlayer->mo->DamageTypeReceived, &painFlash);

	if (painFlash.a != 0)
	{
		cnt = DamageToAlpha[MIN (113, CPlayer->damagecount * painFlash.a / 255)];

		// [BC] Allow users to tone down the intensity of the blood on the screen.
		cnt = (int)( cnt * blood_fade_scalar );

		if (cnt)
		{
			if (cnt > maxpainblend)
				cnt = maxpainblend;

			V_AddBlend (painFlash.r / 255.f, painFlash.g / 255.f, painFlash.b / 255.f, cnt / 255.f, blend);
		}
	}

	// Unlike Doom, I did not have any utility source to look at to find the
	// exact numbers to use here, so I've had to guess by looking at how they
	// affect the white color in Hexen's palette and picking an alpha value
	// that seems reasonable.
	// [Gez] The exact values could be obtained by looking how they affect
	// each color channel in Hexen's palette.

	if (CPlayer->poisoncount)
	{
		cnt = MIN (CPlayer->poisoncount, 64);
		if (paletteflash & PF_POISON)
		{
			V_AddBlend(44/255.f, 92/255.f, 36/255.f, ((cnt + 7) >> 3) * 0.1f, blend);
		}
		else
		{
			V_AddBlend (0.04f, 0.2571f, 0.f, cnt/93.2571428571f, blend);
		}

	}

	if (CPlayer->hazardcount)
	{
		if (paletteflash & PF_HAZARD)
		{
			if (CPlayer->hazardcount > 16*TICRATE || (CPlayer->hazardcount & 8))
			{
				V_AddBlend (0.f, 1.f, 0.f, 0.125f, blend);
			}
		}
		else
		{
			cnt= MIN(CPlayer->hazardcount/8, 64);
			V_AddBlend (0.f, 0.2571f, 0.f, cnt/93.2571428571f, blend);
		}
	}

	if (CPlayer->mo->DamageType == NAME_Ice)
	{
		if (paletteflash & PF_ICE)
		{
			V_AddBlend(0.f, 0.f, 224/255.f, 0.5f, blend);
		}
		else
		{
			V_AddBlend (0.25f, 0.25f, 0.853f, 0.4f, blend);
		}		
	}

	// cap opacity if desired
	if (blend[3] > maxinvalpha) blend[3] = maxinvalpha;
}